

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbclipboard.cpp
# Opt level: O1

QVariant * __thiscall
QXcbClipboardMime::retrieveData_sys
          (QVariant *__return_storage_ptr__,QXcbClipboardMime *this,QString *fmt,QMetaType type)

{
  xcb_window_t xVar1;
  xcb_atom_t target;
  ulong uVar2;
  uint uVar3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  bool hasUtf8;
  bool local_89;
  QList<unsigned_int> local_88;
  QArrayDataPointer<QString> local_70;
  _Storage<QByteArray,_false> local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fmt->d).size != 0) {
    xVar1 = QXcbConnection::selectionOwner
                      (*(QXcbConnection **)(*(long *)(this + 0x18) + 8),*(xcb_atom_t *)(this + 0x10)
                      );
    if (xVar1 != 0) {
      (**(code **)(*(long *)this + 0x68))(&local_70,this);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (uint *)0x0;
      local_88.d.size = 0;
      puVar4 = *(undefined8 **)(this + 0x40);
      if (puVar4 == (undefined8 *)0x0) {
        puVar4 = &QByteArray::_empty;
      }
      uVar3 = (uint)(*(ulong *)(this + 0x48) >> 2);
      QList<unsigned_int>::reserve(&local_88,(long)(int)uVar3);
      if (0 < (int)uVar3) {
        uVar2 = 0;
        do {
          local_58._0_4_ = *(undefined4 *)((long)puVar4 + uVar2 * 4);
          QtPrivate::QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
                    ((QPodArrayOps<unsigned_int> *)&local_88,local_88.d.size,(uint *)&local_58);
          QList<unsigned_int>::end(&local_88);
          uVar2 = uVar2 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar2);
      }
      local_89 = false;
      target = QXcbMime::mimeAtomForFormat
                         (*(QXcbConnection **)(*(long *)(this + 0x18) + 8),fmt,type,&local_88,
                          &local_89);
      if (target == 0) {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      }
      else {
        local_58._M_value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._M_value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._M_value.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QXcbClipboard::getSelection
                  ((optional<QByteArray> *)&local_58._M_value,*(QXcbClipboard **)(this + 0x18),
                   *(xcb_atom_t *)(this + 0x10),target,
                   ((((*(QXcbClipboard **)(this + 0x18))->super_QXcbObject).m_connection)->
                   super_QXcbBasicConnection).m_xcbAtom.m_allAtoms[0x18],0);
        if ((char)puStack_40 == '\0') {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        }
        else {
          QXcbMime::mimeConvertToFormat
                    (__return_storage_ptr__,*(QXcbConnection **)(*(long *)(this + 0x18) + 8),target,
                     &local_58._M_value,fmt,type,local_89);
        }
        if ((char)puStack_40 == '\x01') {
          puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
          if (&(local_58._M_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58._M_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_58._M_value.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_58._M_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_58._M_value.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,4,0x10);
        }
      }
      goto LAB_0013b1ed;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_0013b1ed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant retrieveData_sys(const QString &fmt, QMetaType type) const override
    {
        auto requestedType = type;
        if (fmt.isEmpty() || isEmpty())
            return QVariant();

        (void)formats(); // trigger update of format list

        QList<xcb_atom_t> atoms;
        const xcb_atom_t *targets = (const xcb_atom_t *) format_atoms.data();
        int size = format_atoms.size() / sizeof(xcb_atom_t);
        atoms.reserve(size);
        for (int i = 0; i < size; ++i)
            atoms.append(targets[i]);

        bool hasUtf8 = false;
        xcb_atom_t fmtatom = mimeAtomForFormat(m_clipboard->connection(), fmt, requestedType, atoms, &hasUtf8);

        if (fmtatom == 0)
            return QVariant();

        const std::optional<QByteArray> result = m_clipboard->getDataInFormat(modeAtom, fmtatom);
        if (!result.has_value())
            return QVariant();

        return mimeConvertToFormat(m_clipboard->connection(), fmtatom, result.value(), fmt, requestedType, hasUtf8);
    }